

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAds::testAdsReadReqEx2(TestAds *this,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  test_root local_308;
  test_root local_2e8;
  test_root local_2c8;
  test_root local_2a8;
  test_root local_288;
  test_root local_268;
  test_root local_248;
  test_root local_228;
  test_root local_208;
  test_root local_1e8;
  test_root local_1c8;
  test_root local_1a8;
  test_root local_188;
  AmsNetId local_168 [6];
  undefined2 local_162;
  AmsAddr unknown;
  test_root local_140;
  test_root local_120;
  test_root local_100;
  test_root local_e0;
  test_root local_c0;
  test_root local_a0;
  int local_7c;
  int local_78;
  int i;
  uint32_t buffer;
  uint32_t bytesRead;
  undefined4 local_50 [2];
  uint32_t outBuffer;
  test_root local_40;
  long local_20;
  long port;
  string *param_1_local;
  TestAds *this_local;
  
  port = (long)param_1;
  param_1_local = (string *)this;
  local_20 = AdsPortOpenEx();
  bVar3 = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x138);
  std::__cxx11::string::~string((string *)&local_40);
  print(&server,this->out);
  local_50[0] = 0;
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,4,local_50);
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&buffer);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&buffer,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x13d);
  std::__cxx11::string::~string((string *)&buffer);
  for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,&local_78,(uint *)&i);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_a0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_a0,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x148);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = i == 4;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_c0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_c0,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x149);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = local_78 == 0;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_e0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_e0,"0 == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x14a);
      std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  i = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(0,(AmsAddr *)&server,0x4020,0,4,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_100);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,(string *)&local_100,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x150);
  std::__cxx11::string::~string((string *)&local_100);
  bVar3 = i == -0x21524111;
  fructose::test_root::get_test_name_abi_cxx11_(&local_120);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_120,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x151);
  std::__cxx11::string::~string((string *)&local_120);
  i = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)0x0,0x4020,0,4,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_140);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x749,(string *)&local_140,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x156);
  std::__cxx11::string::~string((string *)&local_140);
  bVar3 = i == -0x21524111;
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&unknown);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&unknown,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x157);
  std::__cxx11::string::~string((string *)&unknown);
  i = -0x21524111;
  AmsNetId::AmsNetId(local_168,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_162 = 0x353;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)local_168,0x4020,0,4,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_188);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 7,(string *)&local_188,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x15d);
  std::__cxx11::string::~string((string *)&local_188);
  bVar3 = i == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_1a8);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_1a8,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x15e);
  std::__cxx11::string::~string((string *)&local_1a8);
  local_78 = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,&local_78,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1c8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_1c8,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x162);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar3 = local_78 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_1e8);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_1e8,"0 == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x163);
  std::__cxx11::string::~string((string *)&local_1e8);
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,(void *)0x0,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_208);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_208,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x167);
  std::__cxx11::string::~string((string *)&local_208);
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,(void *)0x0,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_228);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_228,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x169);
  std::__cxx11::string::~string((string *)&local_228);
  i = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,0,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_248);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_248,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16d);
  std::__cxx11::string::~string((string *)&local_248);
  bVar3 = i == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_268);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_268,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16e);
  std::__cxx11::string::~string((string *)&local_268);
  i = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0,0,4,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_288);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_288,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x174);
  std::__cxx11::string::~string((string *)&local_288);
  bVar3 = i == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_2a8);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_2a8,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x175);
  std::__cxx11::string::~string((string *)&local_2a8);
  i = -0x21524111;
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4025,0x10000,4,&local_78,(uint *)&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_2c8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_2c8,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x17a);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar3 = i == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_2e8);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_2e8,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17b);
  std::__cxx11::string::~string((string *)&local_2e8);
  lVar1 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_308);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_308,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17c);
  std::__cxx11::string::~string((string *)&local_308);
  return;
}

Assistant:

void testAdsReadReqEx2(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        const uint32_t outBuffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        uint32_t bytesRead;
        uint32_t buffer;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, 0 == buffer);
        }

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr));
        fructose_assert(0 == buffer);

        // provide nullptr to buffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead));

        // provide 0 length buffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        //TODO is this a bug? Shouldn't the request fail with ADSERR_DEVICE_INVALIDSIZE?

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }